

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_tools.cxx
# Opt level: O2

void __thiscall
object_tools::save_skl(object_tools *this,xr_object *object,char *source,cl_parser *cl)

{
  string *__args;
  pointer ppxVar1;
  xr_skl_motion *this_00;
  bool bVar2;
  bool bVar3;
  pointer ppxVar4;
  string target;
  string motion_name;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  filter;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  cl_parser::get_string(cl,"-skl",&local_b0);
  create_filter(&local_90,&local_b0);
  ppxVar1 = (object->m_motions).
            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  for (ppxVar4 = (object->m_motions).
                 super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppxVar4 != ppxVar1;
      ppxVar4 = ppxVar4 + 1) {
    this_00 = *ppxVar4;
    __args = &(this_00->super_xr_motion).m_name;
    bVar2 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_90,__args);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_50,(string *)__args);
      if ((this->super_batch_helper).m_output_file._M_string_length == 0) {
        std::operator+(&local_70,&(this->super_batch_helper).m_output_folder,&local_50);
        std::operator+(&local_d0,&local_70,".skl");
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_d0,(string *)&(this->super_batch_helper).m_output_file);
      }
      bVar3 = xray_re::xr_skl_motion::save_skl(this_00,local_d0._M_dataplus._M_p);
      if (!bVar3) {
        xray_re::msg("can\'t save %s",local_d0._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = true;
    }
  }
  if (!bVar3) {
    xray_re::msg("can\'t find motion %s",local_b0._M_dataplus._M_p);
  }
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void object_tools::save_skl(xray_re::xr_object& object, const char* source, const cl_parser& cl) const
{
	std::string motion_name;
	cl.get_string("-skl", motion_name);

	auto filter = create_filter(motion_name);

	bool found = false;
	for (auto el : object.motions()) {
		if (!filter(el->name()))
			continue;

		std::string name{ el->name() };
		std::string target = m_output_file.empty() ? m_output_folder + name + ".skl" : m_output_file;
		if (!el->save_skl(target.c_str()))
			msg("can't save %s", target.c_str());

		found = true;
	}
	if (!found)
		msg("can't find motion %s", motion_name.c_str());
}